

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O1

void tcmalloc::InvokeNewHookSlow(void *p,size_t s)

{
  uint uVar1;
  int iVar2;
  NewHook *pp_Var3;
  ulong uVar4;
  NewHook local_68;
  NewHook hooks [7];
  
  if (base::internal::new_hooks_ == 0) {
    uVar1 = 0;
  }
  else {
    iVar2 = 7;
    uVar1 = 0;
    pp_Var3 = &local_68;
    uVar4 = 1;
    do {
      if ((NewHook)(&base::internal::new_hooks_)[uVar4] != (NewHook)0x0) {
        *pp_Var3 = (NewHook)(&base::internal::new_hooks_)[uVar4];
        pp_Var3 = pp_Var3 + 1;
        uVar1 = uVar1 + 1;
        iVar2 = iVar2 + -1;
      }
    } while ((uVar4 < base::internal::new_hooks_) && (uVar4 = uVar4 + 1, 0 < iVar2));
  }
  if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      (*hooks[uVar4 - 1])(p,s);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return;
}

Assistant:

void InvokeNewHookSlow(const void* p, size_t s) {
  if (IsEmergencyPtr(p)) {
    return;
  }
  MallocHook::NewHook hooks[kHookListMaxValues];
  int num_hooks = base::internal::new_hooks_.Traverse(hooks, kHookListMaxValues);
  for (int i = 0; i < num_hooks; i++) {
    hooks[i](p, s);
  }
}